

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O2

uint32 heap64b_ins(float64 *a,uint32 *k,uint32 sz,float64 a_v,uint32 k_v,hcmpfn64b_t cmp)

{
  int iVar1;
  uint32 uVar2;
  uint uVar3;
  
  uVar2 = sz;
  while( true ) {
    if (uVar2 == 0) break;
    uVar3 = uVar2 - 1 >> 1;
    iVar1 = (*cmp)(a[uVar3],a_v);
    if (iVar1 != 0) break;
    a[uVar2] = a[uVar3];
    k[uVar2] = k[uVar3];
    uVar2 = uVar3;
  }
  a[uVar2] = a_v;
  k[uVar2] = k_v;
  return sz + 1;
}

Assistant:

uint32
heap64b_ins(float64 *a,  uint32 *k, uint32 sz,
	    float64 a_v, uint32 k_v,
	    hcmpfn64b_t cmp)
{
    uint32 i, p;

    ++sz;

    i = sz-1;
    p = PARENT(i);
    /* if the parent does not satisfy the ordering,
     * then switch with i */
    while ((i > 0) && !cmp(a[p], a_v)) {
	a[i] = a[p];
	k[i] = k[p];
	i = p;
	p = PARENT(p);
    }
    a[i] = a_v;
    k[i] = k_v;

    return sz;
}